

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdgeSharpness ON_SubDEdgeSharpness::FromConstant(double sharpness)

{
  double dVar1;
  ON_SubDEdgeSharpness OVar2;
  float local_20;
  float local_1c;
  double sharpness_local;
  ON_SubDEdgeSharpness s;
  
  ON_SubDEdgeSharpness((ON_SubDEdgeSharpness *)&sharpness_local);
  if ((sharpness < 0.0) || (4.0 < sharpness)) {
    if ((sharpness != 5.0) || (NAN(sharpness))) {
      local_20 = ON_FLT_QNAN;
    }
    else {
      local_20 = 5.0;
    }
    local_1c = local_20;
  }
  else {
    dVar1 = Sanitize(sharpness,0.0);
    local_1c = (float)dVar1;
  }
  OVar2.m_edge_sharpness[0] = local_1c;
  OVar2.m_edge_sharpness[1] = local_1c;
  return (ON_SubDEdgeSharpness)OVar2.m_edge_sharpness;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdgeSharpness::FromConstant(
  double sharpness
)
{
  ON_SubDEdgeSharpness s;
  s.m_edge_sharpness[0] 
    = (sharpness >= 0.0 && sharpness  <= ON_SubDEdgeSharpness::MaximumValue) 
    ? ((float)ON_SubDEdgeSharpness::Sanitize(sharpness, 0.0)) 
    : (ON_SubDEdgeSharpness::CreaseValue == sharpness ? ((float)ON_SubDEdgeSharpness::CreaseValue) : ON_FLT_QNAN);
  s.m_edge_sharpness[1] = s.m_edge_sharpness[0];
  return s;
}